

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_proto.c
# Opt level: O2

int synthetic_create_request(application_protocol *proto,request *req)

{
  rand_gen *generator;
  long lVar1;
  void *pvVar2;
  long lVar3;
  long *in_FS_OFFSET;
  double __x;
  
  generator = (rand_gen *)proto->arg;
  lVar1 = *in_FS_OFFSET;
  if (in_FS_OFFSET[-0x2f] == 0) {
    pvVar2 = malloc(8);
    in_FS_OFFSET[-0x2f] = (long)pvVar2;
    if (pvVar2 == (void *)0x0) {
      __assert_fail("per_thread_arg",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                    ,0x69,
                    "int synthetic_create_request(struct application_protocol *, struct request *)")
      ;
    }
  }
  __x = generate(generator);
  lVar3 = lround(__x);
  in_FS_OFFSET[-0x2f] = lVar3;
  req->iovs[0].iov_base = (void *)(lVar1 + -0x178);
  req->iovs[0].iov_len = 8;
  req->iov_cnt = 1;
  req->meta = (void *)0x0;
  return 0;
}

Assistant:

int synthetic_create_request(struct application_protocol *proto,
							 struct request *req)
{
	struct rand_gen *generator = (struct rand_gen *)proto->arg;

	if (!per_thread_arg) {
		per_thread_arg = malloc(sizeof(long));
		assert(per_thread_arg);
	}
	per_thread_arg = (void *)lround(generate(generator));
	req->iovs[0].iov_base = &per_thread_arg;
	req->iovs[0].iov_len = sizeof(long);
	req->iov_cnt = 1;
	req->meta = NULL;

	return 0;
}